

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O1

void __thiscall
Printer_prettyPrintOneString_Test::~Printer_prettyPrintOneString_Test
          (Printer_prettyPrintOneString_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Printer, prettyPrintOneString)
{
    auto printer = libcellml::Printer::create();
    auto model = libcellml::Model::create();
    model->setName("model");
    auto component4 = libcellml::Component::create("component");
    model->addComponent(component4);
    const std::string equation4 =
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\"><apply><eq/><apply><diff/><bvar><ci>t</ci></bvar><ci>X</ci></apply><apply><minus/><apply><times/><ci>alpha_X</ci><apply><minus/><cn cellml:units=\"dimensionless\">1</cn><ci>X</ci></apply></apply><apply><times/><ci>beta_X</ci><ci>X</ci></apply></apply></apply></math>";
    component4->setMath(equation4);

    EXPECT_EQ(PRETTY_MODEL_STRING, printer->printModel(model));
}